

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_conserve.cpp
# Opt level: O2

CavsByColor *
Omega_h::separate_by_color
          (CavsByColor *__return_storage_ptr__,Cavs *cavs,LOs *old_elem_colors,LOs *new_elem_colors)

{
  LO LVar1;
  SeparationResult res;
  Write<int> local_110;
  Write<int> local_100;
  Cavs local_f0;
  SeparationResult local_b0;
  
  (__return_storage_ptr__->super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    LVar1 = Graph::nedges(&cavs->keys2old_elems);
    if (LVar1 == 0) {
      LVar1 = Graph::nedges(&cavs->keys2new_elems);
      if (LVar1 == 0) {
        return __return_storage_ptr__;
      }
    }
    Cavs::Cavs(&local_f0,cavs);
    Write<int>::Write(&local_100,&old_elem_colors->write_);
    Write<int>::Write(&local_110,&new_elem_colors->write_);
    separate_by_color_once(&local_b0,&local_f0,(LOs *)&local_100,(LOs *)&local_110);
    Write<int>::~Write(&local_110);
    Write<int>::~Write(&local_100);
    Cavs::~Cavs(&local_f0);
    std::vector<Omega_h::Cavs,_std::allocator<Omega_h::Cavs>_>::push_back
              (__return_storage_ptr__,&local_b0.separated);
    Cavs::operator=(cavs,&local_b0.remainder);
    SeparationResult::~SeparationResult(&local_b0);
  } while( true );
}

Assistant:

static CavsByColor separate_by_color(
    Cavs cavs, LOs old_elem_colors, LOs new_elem_colors) {
  CavsByColor cavs_by_color;
  while (cavs.keys2old_elems.nedges() || cavs.keys2new_elems.nedges()) {
    auto res = separate_by_color_once(cavs, old_elem_colors, new_elem_colors);
    cavs_by_color.push_back(res.separated);
    cavs = res.remainder;
  }
  return cavs_by_color;
}